

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool array_container_equal_bitset(array_container_t *container1,bitset_container_t *container2)

{
  long lVar1;
  int32_t i;
  long lVar2;
  int iVar3;
  uint64_t uVar5;
  int iVar6;
  long lVar4;
  
  if ((container2->cardinality != -1) && (container2->cardinality != container1->cardinality)) {
    return false;
  }
  lVar2 = 0;
  lVar4 = 0;
  do {
    uVar5 = container2->words[lVar2];
    if (uVar5 != 0) {
      iVar3 = (int)lVar4;
      lVar4 = (long)iVar3;
      iVar6 = container1->cardinality;
      if (container1->cardinality < iVar3) {
        iVar6 = iVar3;
      }
      do {
        if (iVar6 == lVar4) {
          return false;
        }
        lVar1 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        if (((uint)lVar1 | (int)lVar2 << 6) != (uint)container1->array[lVar4]) {
          return false;
        }
        lVar4 = lVar4 + 1;
        uVar5 = uVar5 & uVar5 - 1;
      } while (uVar5 != 0);
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x400) {
      return (int)lVar4 == container1->cardinality;
    }
  } while( true );
}

Assistant:

bool array_container_equal_bitset(const array_container_t* container1,
                                  const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality != container1->cardinality) {
            return false;
        }
    }
    int32_t pos = 0;
    for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
        uint64_t w = container2->words[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            uint16_t r = i * 64 + roaring_trailing_zeroes(w);
            if (pos >= container1->cardinality) {
                return false;
            }
            if (container1->array[pos] != r) {
                return false;
            }
            ++pos;
            w ^= t;
        }
    }
    return (pos == container1->cardinality);
}